

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O2

uint8_t mpt::basetype(type_t org)

{
  if (org == 0) {
    return '\0';
  }
  if (0xff < org) {
    if (org == 0x801) {
      return 0x80;
    }
    if (org != 0x802) {
      return (org < 0x800) << 7;
    }
    org = 0xb;
  }
  return (uint8_t)org;
}

Assistant:

inline __MPT_CONST_TYPE uint8_t basetype(MPT_TYPE(type) org) {
	return (org == 0)
		? 0
		: (org <= _TypeDynamicMax)
			? org
			: (org == TypeArray)
				? TypeBufferPtr
				: (MPT_type_isConvertable(org))
					? TypeConvertablePtr
					: 0;
}